

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O1

int try_preparse_cmd(voccxdef *ctx,char **cmd,int wrdcnt,uchar **preparse_list)

{
  char cVar1;
  uchar uVar2;
  uint16_t tmp;
  short sVar3;
  int iVar4;
  size_t __n;
  ulong uVar5;
  runsdef *prVar6;
  char *__s;
  undefined1 *puVar7;
  runsdef val;
  errdef fr_;
  uchar listbuf [514];
  runsdef local_380;
  errdef local_370;
  short local_238;
  undefined1 local_236 [518];
  
  if (ctx->voccxppc == 0xffff) {
    iVar4 = 0;
  }
  else {
    puVar7 = local_236;
    if (0 < wrdcnt) {
      uVar5 = 0;
      do {
        __s = cmd[uVar5];
        cVar1 = *__s;
        if (cVar1 == '\"') {
          __n = (ulong)*(ushort *)(__s + 1) - 2;
          __s = __s + 3;
          sVar3 = 4;
        }
        else {
          __n = strlen(__s);
          sVar3 = 2;
        }
        *puVar7 = 3;
        *(short *)(puVar7 + 1) = sVar3 + (short)__n;
        if (cVar1 == '\"') {
          puVar7[3] = 0x22;
          puVar7 = puVar7 + 4;
        }
        else {
          puVar7 = puVar7 + 3;
        }
        memcpy(puVar7,__s,__n);
        puVar7 = puVar7 + __n;
        if (cVar1 == '\"') {
          *puVar7 = 0x22;
          puVar7 = puVar7 + 1;
        }
        uVar5 = uVar5 + 1;
      } while ((uint)wrdcnt != uVar5);
    }
    local_380.runsv.runsvstr = (uchar *)&local_238;
    local_238 = (short)puVar7 - local_380.runsv.runsvobj;
    local_380.runstyp = '\a';
    runpush(ctx->voccxrun,7,&local_380);
    iVar4 = _setjmp((__jmp_buf_tag *)local_370.errbuf);
    local_370.errcode = iVar4;
    if (iVar4 == 0) {
      local_370.errprv = ctx->voccxerr->errcxptr;
      ctx->voccxerr->errcxptr = &local_370;
      runfn(ctx->voccxrun,ctx->voccxppc,1);
      ctx->voccxerr->errcxptr = local_370.errprv;
      iVar4 = 0;
    }
    else {
      ctx->voccxerr->errcxptr = local_370.errprv;
      if ((1 < iVar4 - 0x3f5U) && (iVar4 != 0x3fb)) {
        errrse1(ctx->voccxerr,&local_370);
      }
    }
    if (iVar4 == 0) {
      prVar6 = ctx->voccxrun->runcxsp;
      uVar2 = prVar6[-1].runstyp;
      prVar6 = prVar6 + -1;
      ctx->voccxrun->runcxsp = prVar6;
      if (uVar2 == '\a') {
        if (prVar6->runstyp != '\a') {
          ctx->voccxrun->runcxerr->errcxptr->erraac = 0;
          runsign(ctx->voccxrun,0x3fc);
        }
        *preparse_list = (uchar *)ctx->voccxrun->runcxsp->runsv;
        iVar4 = 30000;
      }
      else {
        iVar4 = 0x7531;
        if (uVar2 != '\x05') {
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int try_preparse_cmd(voccxdef *ctx, char **cmd, int wrdcnt,
                     uchar **preparse_list)
{
    uchar    listbuf[VOCBUFSIZ + 2 + 3*VOCBUFSIZ];
    int      i;
    uchar   *p;
    size_t   len;
    runsdef  val;
    int      typ;
    int      err;

    /* if there's no preparseCmd, keep processing */
    if (ctx->voccxppc == MCMONINV)
        return 0;
    
    /* build a list of the words */
    for (p = listbuf + 2, i = 0 ; i < wrdcnt ; ++i)
    {
        char *src;
        int add_quote;
        
        /* check for strings - they require special handling */
        if (cmd[i][0] == '"')
        {
            /* 
             *   it's a string - what follows is a run-time style string,
             *   with a length prefix followed by the text of the string 
             */
            len = osrp2(cmd[i] + 1) - 2;
            src = cmd[i] + 3;

            /* add quotes to the result */
            add_quote = TRUE;
        }
        else
        {
            /* ordinary word - copy directly */
            src = (char *)cmd[i];

            /* it's a null-terminated string */
            len = strlen(src);

            /* don't add quotes to the result */
            add_quote = FALSE;
        }

        /* write the type prefix */
        *p++ = DAT_SSTRING;

        /* write the length prefix */
        oswp2(p, len + 2 + (add_quote ? 2 : 0));
        p += 2;

        /* add an open quote if necessary */
        if (add_quote)
            *p++ = '"';

        /* copy the text */
        memcpy(p, src, len);
        p += len;

        /* add the closing quote if necessary */
        if (add_quote)
            *p++ = '"';
    }
    
    /* set the length of the whole list */
    len = p - listbuf;
    oswp2(listbuf, len);
    
    /* push the list as the argument, and call the user's preparseCmd */
    val.runstyp = DAT_LIST;
    val.runsv.runsvstr = listbuf;
    runpush(ctx->voccxrun, DAT_LIST, &val);

    /* presume that no error will occur */
    err = 0;

    /* catch errors that occur within preparseCmd */
    ERRBEGIN(ctx->voccxerr)
    {
        /* call preparseCmd */
        runfn(ctx->voccxrun, ctx->voccxppc, 1);
    }
    ERRCATCH(ctx->voccxerr, err)
    {
        /* 
         *   if it's abort/exit/exitobj, just return it; for any other
         *   errors, just re-throw the same error 
         */
        switch(err)
        {
        case ERR_RUNABRT:
        case ERR_RUNEXIT:
        case ERR_RUNEXITOBJ:
            /* simply return these errors to the caller */
            break;

        default:
            /* re-throw anything else */
            errrse(ctx->voccxerr);
        }
    }
    ERREND(ctx->voccxerr);

    /* if an error occurred, return the error code */
    if (err != 0)
        return err;

    /* get the result */
    typ = runtostyp(ctx->voccxrun);
    
    /* if they returned a list, it's a new command to execute */
    if (typ == DAT_LIST)
    {
        /* get the list and give it to the caller */
        *preparse_list = runpoplst(ctx->voccxrun);
        
        /* 
         *   indicate that the command is to be reparsed with the new word
         *   list 
         */
        return ERR_PREPRSCMDREDO;
    }

    /* for any other type, we don't need the value, so discard it */
    rundisc(ctx->voccxrun);

    /* if the result is nil, don't process this command further */
    if (typ == DAT_NIL)
        return ERR_PREPRSCMDCAN;
    else
        return 0;
}